

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storedenum.hpp
# Opt level: O2

void __thiscall
stored_flag_reader<setup::task_entry::flags_Enum_>::add
          (stored_flag_reader<setup::task_entry::flags_Enum_> *this,enum_type flag)

{
  byte bVar1;
  uint uVar2;
  size_t sVar3;
  
  sVar3 = this->pos;
  if (sVar3 == 0) {
    this->bytes = this->bytes + 1;
    bVar1 = util::load<unsigned_char,util::little_endian>(this->stream);
    this->buffer = bVar1;
    sVar3 = this->pos;
  }
  else {
    bVar1 = this->buffer;
  }
  uVar2 = (uint)sVar3;
  if ((bVar1 >> (uVar2 & 0x1f) & 1) != 0) {
    flags<setup::component_entry::flags_Enum_,_5UL>::operator|=
              ((flags<setup::component_entry::flags_Enum_,_5UL> *)&this->result,flag);
    uVar2 = (uint)this->pos;
  }
  this->pos = (ulong)(uVar2 + 1 & 7);
  return;
}

Assistant:

void add(enum_type flag) {
		
		if(pos == 0) {
			bytes++;
			buffer = util::load<stored_type>(stream);
		}
		
		if(buffer & (stored_type(1) << pos)) {
			result |= flag;
		}
		
		pos = (pos + 1) % stored_bits;
	}